

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::DefineGroupNode::AnnotatePass2
          (DefineGroupNode *this,Compiler *compiler,CountDomain accumConsumes,
          bool accumPrevWillNotProgress,bool accumPrevWillNotRegress)

{
  ThreadContext *this_00;
  bool accumPrevWillNotRegress_local;
  bool accumPrevWillNotProgress_local;
  Compiler *compiler_local;
  DefineGroupNode *this_local;
  CountDomain accumConsumes_local;
  
  this_00 = Js::ScriptContext::GetThreadContext(compiler->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x6000,compiler->scriptContext,(PVOID)0x0);
  (this->super_Node).prevConsumes = accumConsumes;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffffbf | (uint)accumPrevWillNotProgress << 6;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffff7f | (uint)accumPrevWillNotRegress << 7;
  (*this->body->_vptr_Node[8])
            (this->body,compiler,accumConsumes,(ulong)accumPrevWillNotProgress,
             (ulong)accumPrevWillNotRegress);
  return;
}

Assistant:

void DefineGroupNode::AnnotatePass2(Compiler& compiler, CountDomain accumConsumes, bool accumPrevWillNotProgress, bool accumPrevWillNotRegress)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        prevConsumes = accumConsumes;
        isPrevWillNotProgress = accumPrevWillNotProgress;
        isPrevWillNotRegress = accumPrevWillNotRegress;
        body->AnnotatePass2(compiler, accumConsumes, accumPrevWillNotProgress, accumPrevWillNotRegress);
    }